

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_id(aec_stream_conflict *strm)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int iVar8;
  uint64_t uVar9;
  ulong uVar10;
  
  piVar2 = strm->state;
  iVar4 = 0;
  if (piVar2->rsip == piVar2->rsi_buffer) {
    if ((strm->flags & 0x20) != 0) {
      uVar1 = piVar2->bitp;
      uVar6 = uVar1 + 7;
      if (-1 < (int)uVar1) {
        uVar6 = uVar1;
      }
      piVar2->bitp = uVar6 & 0xfffffff8;
    }
    iVar4 = 1;
    if (piVar2->pp == 0) goto LAB_00103c2f;
  }
  piVar2->ref = iVar4;
LAB_00103c2f:
  iVar4 = piVar2->id_len;
  iVar5 = piVar2->bitp;
  if (iVar5 < iVar4) {
    sVar7 = strm->avail_in;
    do {
      sVar7 = sVar7 - 1;
      if (sVar7 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar7;
      uVar10 = piVar2->acc << 8;
      piVar2->acc = uVar10;
      pbVar3 = strm->next_in;
      strm->next_in = pbVar3 + 1;
      uVar9 = *pbVar3 | uVar10;
      piVar2->acc = uVar9;
      iVar5 = iVar5 + 8;
      piVar2->bitp = iVar5;
    } while (iVar5 < iVar4);
  }
  else {
    uVar9 = piVar2->acc;
  }
  iVar8 = (int)(((uVar9 >> ((byte)(iVar5 - iVar4) & 0x3f)) << (-(char)iVar4 & 0x3fU)) >>
               (-(char)iVar4 & 0x3fU));
  piVar2->id = iVar8;
  piVar2->bitp = iVar5 - iVar4;
  piVar2->mode = piVar2->id_table[iVar8];
  return 1;
}

Assistant:

static int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    if (state->rsip == state->rsi_buffer) {
        if(strm->flags & AEC_PAD_RSI)
            state->bitp -= state->bitp % 8;
        if (state->pp)
            state->ref = 1;
    } else {
        state->ref = 0;
    }
    if (bits_ask(strm, state->id_len) == 0)
        return M_EXIT;
    state->id = bits_get(strm, state->id_len);
    bits_drop(strm, state->id_len);
    state->mode = state->id_table[state->id];

    return M_CONTINUE;
}